

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int * Abc_NtkSimulateOneNode(Abc_Ntk_t *pNtk,int *pModel,int input,Vec_Ptr_t **topOrder)

{
  int iVar1;
  long *plVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  uint *__ptr;
  void *pvVar7;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar7 = malloc(400);
  *(void **)(__ptr + 2) = pvVar7;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar12 = (long)iVar1 + 500;
    iVar14 = (int)uVar12;
    if ((pNtk->vTravIds).nCap < iVar14) {
      piVar8 = (int *)malloc(uVar12 * 4);
      (pNtk->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar14;
    }
    else {
      piVar8 = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(piVar8,0,(uVar12 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar14;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  if ((input < 0) || (pNtk->vCis->nSize <= input)) {
LAB_00299695:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  *(int *)((long)pNtk->vCis->pArray[(uint)input] + 0x40) = pModel[(uint)input];
  uVar13 = 0;
  if (0 < (long)topOrder[(uint)input]->nSize) {
    uVar15 = 0x32;
    uVar12 = (long)topOrder[(uint)input]->nSize;
    do {
      if ((long)topOrder[(uint)input]->nSize < (long)uVar12) goto LAB_00299695;
      plVar2 = (long *)topOrder[(uint)input]->pArray[uVar12 - 1];
      lVar10 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
      uVar6 = (*(uint *)((long)plVar2 + 0x14) >> 0xb & 1 ^
              *(uint *)(*(long *)(lVar10 + (long)((int *)plVar2[4])[1] * 8) + 0x40)) &
              (*(uint *)((long)plVar2 + 0x14) >> 10 & 1 ^
              *(uint *)(*(long *)(lVar10 + (long)*(int *)plVar2[4] * 8) + 0x40));
      if (*(uint *)(plVar2 + 8) != uVar6) {
        *(uint *)(plVar2 + 8) = uVar6;
        uVar6 = (uint)uVar15;
        if (uVar13 == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = 0x10;
            uVar15 = 0x10;
          }
          else {
            uVar15 = (ulong)(uVar6 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(uVar15 * 8);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),uVar15 * 8);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = uVar6 * 2;
          }
        }
        else {
          pvVar7 = *(void **)(__ptr + 2);
        }
        lVar10 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        __ptr[1] = uVar13;
        *(long **)((long)pvVar7 + lVar10 * 8) = plVar2;
      }
      bVar5 = 1 < uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar5);
  }
  pVVar3 = pNtk->vCos;
  lVar10 = (long)pVVar3->nSize;
  piVar8 = (int *)malloc(lVar10 * 4);
  if (0 < lVar10) {
    ppvVar4 = pVVar3->pArray;
    lVar11 = 0;
    do {
      plVar2 = (long *)ppvVar4[lVar11];
      piVar8[lVar11] =
           *(uint *)((long)plVar2 + 0x14) >> 10 & 1 ^
           *(uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[4] * 8) + 0x40);
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  if (pNtk->vCis->nSize <= input) goto LAB_00299695;
  pvVar7 = pNtk->vCis->pArray[(uint)input];
  *(ulong *)((long)pvVar7 + 0x40) = (ulong)(*(long *)((long)pvVar7 + 0x40) != 1);
  pvVar7 = *(void **)(__ptr + 2);
  if ((int)uVar13 < 1) {
    if (pvVar7 == (void *)0x0) goto LAB_0029967b;
  }
  else {
    uVar12 = 0;
    do {
      lVar10 = *(long *)((long)pvVar7 + uVar12 * 8);
      *(ulong *)(lVar10 + 0x40) = (ulong)(*(long *)(lVar10 + 0x40) != 1);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  free(pvVar7);
LAB_0029967b:
  free(__ptr);
  return piVar8;
}

Assistant:

int * Abc_NtkSimulateOneNode( Abc_Ntk_t * pNtk, int * pModel, int input, Vec_Ptr_t ** topOrder )
{
    Abc_Obj_t * pNode;
    Vec_Ptr_t * vNodes;
    int * pValues, Value0, Value1, i;
   
    vNodes = Vec_PtrAlloc( 50 );
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values     
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    pNode = Abc_NtkCi(pNtk, input);
    pNode->iTemp = pModel[input];
    
    // simulate in the topological order    
    for(i = Vec_PtrSize(topOrder[input])-1; i >= 0; i--)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(topOrder[input], i);        
        
        Value0 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRUINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ Abc_ObjFaninC1(pNode);
        
        if( pNode->iTemp != (Value0 & Value1))
        {
            pNode->iTemp = (Value0 & Value1);
            Vec_PtrPush(vNodes, pNode);
        }
    
    }    
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRUINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ Abc_ObjFaninC0(pNode);
    
    pNode = Abc_NtkCi(pNtk, input);
    if(pNode->pCopy == (Abc_Obj_t *)1)
        pNode->pCopy = (Abc_Obj_t *)0;
    else
        pNode->pCopy = (Abc_Obj_t *)1;

    for(i = 0; i < Vec_PtrSize(vNodes); i++)
    {
        pNode = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i);

        if(pNode->pCopy == (Abc_Obj_t *)1)
            pNode->pCopy = (Abc_Obj_t *)0;
        else
            pNode->pCopy = (Abc_Obj_t *)1;
    }

    Vec_PtrFree( vNodes );

    return pValues;
}